

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_params.h
# Opt level: O0

bool __thiscall
google::protobuf::compiler::javanano::Params::java_multiple_files(Params *this,string *file_name)

{
  _Self local_30;
  _Self local_28;
  string *local_20;
  string *file_name_local;
  Params *this_local;
  
  if (this->override_java_multiple_files_ == JAVANANO_MUL_FALSE) {
    this_local._7_1_ = false;
  }
  else if (this->override_java_multiple_files_ == JAVANANO_MUL_TRUE) {
    this_local._7_1_ = true;
  }
  else {
    local_20 = file_name;
    file_name_local = &this->empty_;
    local_28._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::find(&this->java_multiple_files_,file_name);
    local_30._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&this->java_multiple_files_);
    this_local._7_1_ = std::operator!=(&local_28,&local_30);
  }
  return this_local._7_1_;
}

Assistant:

bool java_multiple_files(const string& file_name) const {
    switch (override_java_multiple_files_) {
      case JAVANANO_MUL_FALSE:
        return false;
      case JAVANANO_MUL_TRUE:
        return true;
      default:
        return java_multiple_files_.find(file_name)
                != java_multiple_files_.end();
    }
  }